

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  SyntaxNode *args_4;
  AcceptOnPropertyExprSyntax *pAVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_61;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),&local_61,(BumpAllocator *)__child_stack);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AcceptOnPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,(ExpressionSyntax *)args_2,
                      &local_60,(PropertyExprSyntax *)args_4);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AcceptOnPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AcceptOnPropertyExprSyntax>(
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc)
    );
}